

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flv2srt.c
# Opt level: O2

int main(int argc,char **argv)

{
  size_t size;
  byte bVar1;
  char *flv;
  int iVar2;
  flvtag_avcpackettype_t fVar3;
  FILE *flv_00;
  srt_t *srt;
  size_t sVar4;
  byte *pbVar5;
  char *__format;
  ulong uVar6;
  double dVar7;
  double dVar8;
  flvtag_t tag;
  int has_video;
  int has_audio;
  caption_frame_t frame;
  mpeg_bitstream_t mpegbs;
  
  flv = argv[1];
  flvtag_init(&tag);
  caption_frame_init(&frame);
  mpeg_bitstream_init(&mpegbs);
  flv_00 = flv_open_read(flv);
  srt = srt_new();
  iVar2 = flv_read_header(flv_00,&has_audio,&has_video);
  __format = "Reading from \'%s\'\n";
  if (iVar2 == 0) {
    __format = "\'%s\' Not an flv file\n";
  }
  fprintf(_stderr,__format,flv);
  do {
    do {
      iVar2 = flv_read_tag(flv_00,&tag);
      if (iVar2 == 0) {
        srt_dump(srt);
        srt_free(srt);
        return 1;
      }
      fVar3 = flvtag_avcpackettype(&tag);
    } while (fVar3 != flvtag_avcpackettype_nalu);
    sVar4 = flvtag_payload_size(&tag);
    pbVar5 = flvtag_payload_data(&tag);
    while (0 < (long)sVar4) {
      uVar6 = (ulong)pbVar5[2] << 8 | (long)(int)((uint)*pbVar5 << 0x18) | (ulong)pbVar5[1] << 0x10;
      bVar1 = pbVar5[3];
      size = uVar6 + bVar1;
      dVar7 = flvtag_dts_seconds(&tag);
      dVar8 = flvtag_cts_seconds(&tag);
      mpeg_bitstream_parse(&mpegbs,&frame,(uint8_t *)"",3,0x1b,dVar7,dVar8);
      dVar7 = flvtag_dts_seconds(&tag);
      dVar8 = flvtag_cts_seconds(&tag);
      mpeg_bitstream_parse(&mpegbs,&frame,pbVar5 + 4,size,0x1b,dVar7,dVar8);
      pbVar5 = pbVar5 + size + 4;
      sVar4 = sVar4 - (bVar1 + uVar6 + 4);
      if (mpegbs.status != LIBCAPTION_OK) {
        if (mpegbs.status != LIBCAPTION_READY) {
          fwrite("LIBCAPTION_ERROR == mpeg_bitstream_parse()\n",0x2b,1,_stderr);
          mpeg_bitstream_init(&mpegbs);
          return 1;
        }
        caption_frame_dump(&frame);
        vtt_cue_from_caption_frame(&frame,srt);
      }
    }
  } while( true );
}

Assistant:

int main(int argc, char** argv)
{
    flvtag_t tag;
    srt_t* srt = 0;
    int has_audio, has_video;
    caption_frame_t frame;
    mpeg_bitstream_t mpegbs;
    const char* path = argv[1];

    flvtag_init(&tag);
    caption_frame_init(&frame);
    mpeg_bitstream_init(&mpegbs);

    FILE* flv = flv_open_read(path);
    srt = srt_new();

    if (!flv_read_header(flv, &has_audio, &has_video)) {
        fprintf(stderr, "'%s' Not an flv file\n", path);
    } else {
        fprintf(stderr, "Reading from '%s'\n", path);
    }

    while (flv_read_tag(flv, &tag)) {
        if (flvtag_avcpackettype_nalu == flvtag_avcpackettype(&tag)) {
            ssize_t size = flvtag_payload_size(&tag);
            uint8_t* data = flvtag_payload_data(&tag);

            while (0 < size) {
                size_t nalu_size = (data[0] << 24) | (data[1] << 16) | (data[2] << 8) | data[3];
                mpeg_bitstream_parse(&mpegbs, &frame, (const uint8_t*)"\0\0\1", 3, STREAM_TYPE_H264, flvtag_dts_seconds(&tag), flvtag_cts_seconds(&tag));
                mpeg_bitstream_parse(&mpegbs, &frame, &data[LENGTH_SIZE], nalu_size, STREAM_TYPE_H264, flvtag_dts_seconds(&tag), flvtag_cts_seconds(&tag));
                data += nalu_size + LENGTH_SIZE, size -= nalu_size + LENGTH_SIZE;
                switch (mpeg_bitstream_status(&mpegbs)) {
                default:
                case LIBCAPTION_ERROR:
                    fprintf(stderr, "LIBCAPTION_ERROR == mpeg_bitstream_parse()\n");
                    mpeg_bitstream_init(&mpegbs);
                    return EXIT_FAILURE;
                    break;

                case LIBCAPTION_OK:
                    break;

                case LIBCAPTION_READY: {
                    caption_frame_dump(&frame);
                    srt_cue_from_caption_frame(&frame, srt);
                } break;
                } //switch
            }
        }
    }

    srt_dump(srt);
    srt_free(srt);

    return 1;
}